

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::KillOperandFromDebugInstructions(IRContext *this,Instruction *inst)

{
  bool bVar1;
  OpenCLDebugInfo100Instructions OVar2;
  CommonDebugInfoInstructions CVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  Operand *pOVar6;
  uint *puVar7;
  DebugInfoManager *pDVar8;
  DefUseManager *pDVar9;
  Operand *operand_1;
  undefined1 local_40 [8];
  inst_iterator it_1;
  Operand *operand;
  undefined1 local_28 [8];
  inst_iterator it;
  uint32_t id;
  Op opcode;
  Instruction *inst_local;
  IRContext *this_local;
  
  it.super_iterator.node_._4_4_ = opt::Instruction::opcode(inst);
  it.super_iterator.node_._0_4_ = opt::Instruction::result_id(inst);
  if (it.super_iterator.node_._4_4_ == OpFunction) {
    module(this);
    Module::ext_inst_debuginfo_begin((Module *)local_28);
    while( true ) {
      module(this);
      Module::ext_inst_debuginfo_end((Module *)&operand);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_28,
                                (iterator_template<spvtools::opt::Instruction> *)&operand);
      if (!bVar1) break;
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_28);
      OVar2 = opt::Instruction::GetOpenCL100DebugOpcode(pIVar5);
      if (OVar2 == OpenCLDebugInfo100DebugFunction) {
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)local_28);
        it_1.super_iterator.node_ = (iterator)opt::Instruction::GetOperand(pIVar5,0xd);
        puVar7 = utils::SmallVector<unsigned_int,_2UL>::operator[]
                           ((OperandData *)
                            &(((Instruction *)it_1.super_iterator.node_)->
                             super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_,0);
        if (*puVar7 == (uint32_t)it.super_iterator.node_) {
          pDVar8 = get_debug_info_mgr(this);
          pIVar5 = analysis::DebugInfoManager::GetDebugInfoNone(pDVar8);
          uVar4 = opt::Instruction::result_id(pIVar5);
          puVar7 = utils::SmallVector<unsigned_int,_2UL>::operator[]
                             ((SmallVector<unsigned_int,_2UL> *)
                              ((long)it_1.super_iterator.node_ + 8),0);
          *puVar7 = uVar4;
          pDVar9 = get_def_use_mgr(this);
          pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)local_28);
          analysis::DefUseManager::AnalyzeInstUse(pDVar9,pIVar5);
        }
      }
      InstructionList::iterator::operator++((iterator *)local_28);
    }
  }
  if ((it.super_iterator.node_._4_4_ == OpVariable) ||
     (bVar1 = IsConstantInst(it.super_iterator.node_._4_4_), bVar1)) {
    module(this);
    Module::ext_inst_debuginfo_begin((Module *)local_40);
    while( true ) {
      module(this);
      Module::ext_inst_debuginfo_end((Module *)&operand_1);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_40,
                                (iterator_template<spvtools::opt::Instruction> *)&operand_1);
      if (!bVar1) break;
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_40);
      CVar3 = opt::Instruction::GetCommonDebugOpcode(pIVar5);
      if (CVar3 == CommonDebugInfoDebugGlobalVariable) {
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)local_40);
        pOVar6 = opt::Instruction::GetOperand(pIVar5,0xb);
        puVar7 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar6->words,0);
        if (*puVar7 == (uint32_t)it.super_iterator.node_) {
          pDVar8 = get_debug_info_mgr(this);
          pIVar5 = analysis::DebugInfoManager::GetDebugInfoNone(pDVar8);
          uVar4 = opt::Instruction::result_id(pIVar5);
          puVar7 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar6->words,0);
          *puVar7 = uVar4;
          pDVar9 = get_def_use_mgr(this);
          pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)local_40);
          analysis::DefUseManager::AnalyzeInstUse(pDVar9,pIVar5);
        }
      }
      InstructionList::iterator::operator++((iterator *)local_40);
    }
  }
  return;
}

Assistant:

void IRContext::KillOperandFromDebugInstructions(Instruction* inst) {
  const auto opcode = inst->opcode();
  const uint32_t id = inst->result_id();
  // Kill id of OpFunction from DebugFunction.
  if (opcode == spv::Op::OpFunction) {
    for (auto it = module()->ext_inst_debuginfo_begin();
         it != module()->ext_inst_debuginfo_end(); ++it) {
      if (it->GetOpenCL100DebugOpcode() != OpenCLDebugInfo100DebugFunction)
        continue;
      auto& operand = it->GetOperand(kDebugFunctionOperandFunctionIndex);
      if (operand.words[0] == id) {
        operand.words[0] =
            get_debug_info_mgr()->GetDebugInfoNone()->result_id();
        get_def_use_mgr()->AnalyzeInstUse(&*it);
      }
    }
  }
  // Kill id of OpVariable for global variable from DebugGlobalVariable.
  if (opcode == spv::Op::OpVariable || IsConstantInst(opcode)) {
    for (auto it = module()->ext_inst_debuginfo_begin();
         it != module()->ext_inst_debuginfo_end(); ++it) {
      if (it->GetCommonDebugOpcode() != CommonDebugInfoDebugGlobalVariable)
        continue;
      auto& operand = it->GetOperand(kDebugGlobalVariableOperandVariableIndex);
      if (operand.words[0] == id) {
        operand.words[0] =
            get_debug_info_mgr()->GetDebugInfoNone()->result_id();
        get_def_use_mgr()->AnalyzeInstUse(&*it);
      }
    }
  }
}